

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O1

int mbedtls_pem_read_buffer
              (mbedtls_pem_context *ctx,char *header,char *footer,uchar *data,uchar *pwd,
              size_t pwdlen,size_t *use_len)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uchar *puVar6;
  size_t sVar7;
  uchar *src;
  size_t slen;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  size_t local_38;
  size_t len;
  
  if (ctx == (mbedtls_pem_context *)0x0) {
    iVar4 = -0x1480;
  }
  else {
    puVar5 = (uchar *)strstr((char *)data,header);
    iVar4 = -0x1080;
    if (puVar5 != (uchar *)0x0) {
      puVar6 = (uchar *)strstr((char *)data,footer);
      if (puVar5 < puVar6) {
        sVar7 = strlen(header);
        lVar1 = (puVar5[sVar7] == ' ') + sVar7;
        if (puVar5[(ulong)(puVar5[(puVar5[sVar7] == ' ') + sVar7] == '\r') + lVar1] == '\n') {
          lVar1 = (ulong)(puVar5[(puVar5[sVar7] == ' ') + sVar7] == '\r') + lVar1;
          src = puVar5 + lVar1 + 1;
          sVar7 = strlen(footer);
          lVar2 = (puVar6[sVar7] == ' ') + sVar7;
          *use_len = (size_t)(puVar6 + (((ulong)(puVar6[(ulong)(puVar6[(puVar6[sVar7] == ' ') +
                                                                       sVar7] == '\r') + lVar2] ==
                                                '\n') +
                                        (ulong)(puVar6[(puVar6[sVar7] == ' ') + sVar7] == '\r') +
                                        lVar2) - (long)data));
          slen = (long)puVar6 - (long)src;
          if (((long)slen < 0x16) ||
             (auVar9[0] = -(puVar5[lVar1 + 7] == 'y'), auVar9[1] = -(puVar5[lVar1 + 8] == 'p'),
             auVar9[2] = -(puVar5[lVar1 + 9] == 'e'), auVar9[3] = -(puVar5[lVar1 + 10] == ':'),
             auVar9[4] = -(puVar5[lVar1 + 0xb] == ' '), auVar9[5] = -(puVar5[lVar1 + 0xc] == '4'),
             auVar9[6] = -(puVar5[lVar1 + 0xd] == ','), auVar9[7] = -(puVar5[lVar1 + 0xe] == 'E'),
             auVar9[8] = -(puVar5[lVar1 + 0xf] == 'N'), auVar9[9] = -(puVar5[lVar1 + 0x10] == 'C'),
             auVar9[10] = -(puVar5[lVar1 + 0x11] == 'R'),
             auVar9[0xb] = -(puVar5[lVar1 + 0x12] == 'Y'),
             auVar9[0xc] = -(puVar5[lVar1 + 0x13] == 'P'),
             auVar9[0xd] = -(puVar5[lVar1 + 0x14] == 'T'),
             auVar9[0xe] = -(puVar5[lVar1 + 0x15] == 'E'),
             auVar9[0xf] = -(puVar5[lVar1 + 0x16] == 'D'), auVar8[0] = -(*src == 'P'),
             auVar8[1] = -(puVar5[lVar1 + 2] == 'r'), auVar8[2] = -(puVar5[lVar1 + 3] == 'o'),
             auVar8[3] = -(puVar5[lVar1 + 4] == 'c'), auVar8[4] = -(puVar5[lVar1 + 5] == '-'),
             auVar8[5] = -(puVar5[lVar1 + 6] == 'T'), auVar8[6] = -(puVar5[lVar1 + 7] == 'y'),
             auVar8[7] = -(puVar5[lVar1 + 8] == 'p'), auVar8[8] = -(puVar5[lVar1 + 9] == 'e'),
             auVar8[9] = -(puVar5[lVar1 + 10] == ':'), auVar8[10] = -(puVar5[lVar1 + 0xb] == ' '),
             auVar8[0xb] = -(puVar5[lVar1 + 0xc] == '4'),
             auVar8[0xc] = -(puVar5[lVar1 + 0xd] == ','),
             auVar8[0xd] = -(puVar5[lVar1 + 0xe] == 'E'),
             auVar8[0xe] = -(puVar5[lVar1 + 0xf] == 'N'),
             auVar8[0xf] = -(puVar5[lVar1 + 0x10] == 'C'), auVar8 = auVar8 & auVar9,
             (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) != 0xffff)) {
            iVar4 = -0x1100;
            if (src < puVar6) {
              iVar3 = mbedtls_base64_decode((uchar *)0x0,0,&local_38,src,slen);
              sVar7 = local_38;
              iVar4 = -0x112c;
              if (iVar3 != -0x2c) {
                puVar5 = (uchar *)calloc(1,local_38);
                if (puVar5 == (uchar *)0x0) {
                  iVar4 = -0x1180;
                }
                else {
                  iVar4 = mbedtls_base64_decode(puVar5,sVar7,&local_38,src,slen);
                  if (iVar4 == 0) {
                    ctx->buf = puVar5;
                    ctx->buflen = local_38;
                    iVar4 = 0;
                  }
                  else {
                    mbedtls_zeroize_and_free(puVar5,local_38);
                    iVar4 = iVar4 + -0x1100;
                  }
                }
              }
            }
          }
          else {
            iVar4 = -0x1400;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int mbedtls_pem_read_buffer(mbedtls_pem_context *ctx, const char *header, const char *footer,
                            const unsigned char *data, const unsigned char *pwd,
                            size_t pwdlen, size_t *use_len)
{
    int ret, enc;
    size_t len;
    unsigned char *buf;
    const unsigned char *s1, *s2, *end;
#if defined(PEM_RFC1421)
    unsigned char pem_iv[16];
    mbedtls_cipher_type_t enc_alg = MBEDTLS_CIPHER_NONE;
#else
    ((void) pwd);
    ((void) pwdlen);
#endif /* PEM_RFC1421 */

    if (ctx == NULL) {
        return MBEDTLS_ERR_PEM_BAD_INPUT_DATA;
    }

    s1 = (unsigned char *) strstr((const char *) data, header);

    if (s1 == NULL) {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    s2 = (unsigned char *) strstr((const char *) data, footer);

    if (s2 == NULL || s2 <= s1) {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    s1 += strlen(header);
    if (*s1 == ' ') {
        s1++;
    }
    if (*s1 == '\r') {
        s1++;
    }
    if (*s1 == '\n') {
        s1++;
    } else {
        return MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT;
    }

    end = s2;
    end += strlen(footer);
    if (*end == ' ') {
        end++;
    }
    if (*end == '\r') {
        end++;
    }
    if (*end == '\n') {
        end++;
    }
    *use_len = end - data;

    enc = 0;

    if (s2 - s1 >= 22 && memcmp(s1, "Proc-Type: 4,ENCRYPTED", 22) == 0) {
#if defined(PEM_RFC1421)
        enc++;

        s1 += 22;
        if (*s1 == '\r') {
            s1++;
        }
        if (*s1 == '\n') {
            s1++;
        } else {
            return MBEDTLS_ERR_PEM_INVALID_DATA;
        }


#if defined(MBEDTLS_DES_C)
        if (s2 - s1 >= 23 && memcmp(s1, "DEK-Info: DES-EDE3-CBC,", 23) == 0) {
            enc_alg = MBEDTLS_CIPHER_DES_EDE3_CBC;

            s1 += 23;
            if (s2 - s1 < 16 || pem_get_iv(s1, pem_iv, 8) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 16;
        } else if (s2 - s1 >= 18 && memcmp(s1, "DEK-Info: DES-CBC,", 18) == 0) {
            enc_alg = MBEDTLS_CIPHER_DES_CBC;

            s1 += 18;
            if (s2 - s1 < 16 || pem_get_iv(s1, pem_iv, 8) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 16;
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if (s2 - s1 >= 14 && memcmp(s1, "DEK-Info: AES-", 14) == 0) {
            if (s2 - s1 < 22) {
                return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
            } else if (memcmp(s1, "DEK-Info: AES-128-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_128_CBC;
            } else if (memcmp(s1, "DEK-Info: AES-192-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_192_CBC;
            } else if (memcmp(s1, "DEK-Info: AES-256-CBC,", 22) == 0) {
                enc_alg = MBEDTLS_CIPHER_AES_256_CBC;
            } else {
                return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
            }

            s1 += 22;
            if (s2 - s1 < 32 || pem_get_iv(s1, pem_iv, 16) != 0) {
                return MBEDTLS_ERR_PEM_INVALID_ENC_IV;
            }

            s1 += 32;
        }
#endif /* MBEDTLS_AES_C */

        if (enc_alg == MBEDTLS_CIPHER_NONE) {
            return MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG;
        }

        if (*s1 == '\r') {
            s1++;
        }
        if (*s1 == '\n') {
            s1++;
        } else {
            return MBEDTLS_ERR_PEM_INVALID_DATA;
        }
#else
        return MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE;
#endif /* PEM_RFC1421 */
    }

    if (s1 >= s2) {
        return MBEDTLS_ERR_PEM_INVALID_DATA;
    }

    ret = mbedtls_base64_decode(NULL, 0, &len, s1, s2 - s1);

    if (ret == MBEDTLS_ERR_BASE64_INVALID_CHARACTER) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PEM_INVALID_DATA, ret);
    }

    if ((buf = mbedtls_calloc(1, len)) == NULL) {
        return MBEDTLS_ERR_PEM_ALLOC_FAILED;
    }

    if ((ret = mbedtls_base64_decode(buf, len, &len, s1, s2 - s1)) != 0) {
        mbedtls_zeroize_and_free(buf, len);
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PEM_INVALID_DATA, ret);
    }

    if (enc != 0) {
#if defined(PEM_RFC1421)
        if (pwd == NULL) {
            mbedtls_zeroize_and_free(buf, len);
            return MBEDTLS_ERR_PEM_PASSWORD_REQUIRED;
        }

        ret = 0;

#if defined(MBEDTLS_DES_C)
        if (enc_alg == MBEDTLS_CIPHER_DES_EDE3_CBC) {
            ret = pem_des3_decrypt(pem_iv, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_DES_CBC) {
            ret = pem_des_decrypt(pem_iv, buf, len, pwd, pwdlen);
        }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
        if (enc_alg == MBEDTLS_CIPHER_AES_128_CBC) {
            ret = pem_aes_decrypt(pem_iv, 16, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_AES_192_CBC) {
            ret = pem_aes_decrypt(pem_iv, 24, buf, len, pwd, pwdlen);
        } else if (enc_alg == MBEDTLS_CIPHER_AES_256_CBC) {
            ret = pem_aes_decrypt(pem_iv, 32, buf, len, pwd, pwdlen);
        }
#endif /* MBEDTLS_AES_C */

        if (ret != 0) {
            mbedtls_free(buf);
            return ret;
        }

        /*
         * The result will be ASN.1 starting with a SEQUENCE tag, with 1 to 3
         * length bytes (allow 4 to be sure) in all known use cases.
         *
         * Use that as a heuristic to try to detect password mismatches.
         */
        if (len <= 2 || buf[0] != 0x30 || buf[1] > 0x83) {
            mbedtls_zeroize_and_free(buf, len);
            return MBEDTLS_ERR_PEM_PASSWORD_MISMATCH;
        }
#else
        mbedtls_zeroize_and_free(buf, len);
        return MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE;
#endif /* PEM_RFC1421 */
    }

    ctx->buf = buf;
    ctx->buflen = len;

    return 0;
}